

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_fopen(mg_connection *conn,char *path,int mode,mg_file *filep)

{
  int iVar1;
  FILE *pFVar2;
  int found;
  mg_file *filep_local;
  int mode_local;
  char *path_local;
  mg_connection *conn_local;
  
  if (filep == (mg_file *)0x0) {
    conn_local._4_4_ = 0;
  }
  else {
    (filep->access).fp = (FILE *)0x0;
    iVar1 = mg_path_suspicious(conn,path);
    if (iVar1 == 0) {
      iVar1 = mg_stat(conn,path,&filep->stat);
      if ((mode == 1) && (iVar1 == 0)) {
        conn_local._4_4_ = 0;
      }
      else {
        if (mode == 1) {
          pFVar2 = fopen64(path,"r");
          (filep->access).fp = (FILE *)pFVar2;
        }
        else if (mode == 2) {
          pFVar2 = fopen64(path,"w");
          (filep->access).fp = (FILE *)pFVar2;
        }
        else if (mode == 4) {
          pFVar2 = fopen64(path,"a");
          (filep->access).fp = (FILE *)pFVar2;
        }
        if (iVar1 == 0) {
          mg_stat(conn,path,&filep->stat);
        }
        conn_local._4_4_ = (uint)((filep->access).fp != (FILE *)0x0);
      }
    }
    else {
      conn_local._4_4_ = 0;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static int
mg_fopen(const struct mg_connection *conn,
         const char *path,
         int mode,
         struct mg_file *filep)
{
	int found;

	if (!filep) {
		return 0;
	}
	filep->access.fp = NULL;

	if (mg_path_suspicious(conn, path)) {
		return 0;
	}

	/* filep is initialized in mg_stat: all fields with memset to,
	 * some fields like size and modification date with values */
	found = mg_stat(conn, path, &(filep->stat));

	if ((mode == MG_FOPEN_MODE_READ) && (!found)) {
		/* file does not exist and will not be created */
		return 0;
	}

#if defined(_WIN32)
	{
		wchar_t wbuf[UTF16_PATH_MAX];
		path_to_unicode(conn, path, wbuf, ARRAY_SIZE(wbuf));
		switch (mode) {
		case MG_FOPEN_MODE_READ:
			filep->access.fp = _wfopen(wbuf, L"rb");
			break;
		case MG_FOPEN_MODE_WRITE:
			filep->access.fp = _wfopen(wbuf, L"wb");
			break;
		case MG_FOPEN_MODE_APPEND:
			filep->access.fp = _wfopen(wbuf, L"ab");
			break;
		}
	}
#else
	/* Linux et al already use unicode. No need to convert. */
	switch (mode) {
	case MG_FOPEN_MODE_READ:
		filep->access.fp = fopen(path, "r");
		break;
	case MG_FOPEN_MODE_WRITE:
		filep->access.fp = fopen(path, "w");
		break;
	case MG_FOPEN_MODE_APPEND:
		filep->access.fp = fopen(path, "a");
		break;
	}

#endif
	if (!found) {
		/* File did not exist before fopen was called.
		 * Maybe it has been created now. Get stat info
		 * like creation time now. */
		found = mg_stat(conn, path, &(filep->stat));
		(void)found;
	}

	/* return OK if file is opened */
	return (filep->access.fp != NULL);
}